

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaSimple.c
# Opt level: O1

Pla_Man_t * Pla_ManFxPrepare(int nVars)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  Vec_Bit_t *__ptr;
  Vec_Wrd_t *__ptr_00;
  long lVar4;
  Pla_Man_t *pPVar5;
  char *pcVar6;
  size_t sVar7;
  int *piVar8;
  word *pwVar9;
  Vec_Int_t *pVVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  bool bVar19;
  char Buffer [1000];
  char local_418 [1000];
  
  __ptr = Pla_ManPrimesTable(nVars);
  __ptr_00 = Pla_ManFxMinimize((word *)__ptr->pArray,nVars);
  sprintf(local_418,"primes%02d",(ulong)(uint)nVars);
  uVar3 = __ptr_00->nSize;
  uVar17 = (ulong)uVar3;
  lVar4 = (long)(int)uVar3;
  pPVar5 = (Pla_Man_t *)calloc(1,0x98);
  pcVar6 = Extra_FileDesignName(local_418);
  pPVar5->pName = pcVar6;
  sVar7 = strlen(local_418);
  pcVar6 = (char *)malloc(sVar7 + 1);
  strcpy(pcVar6,local_418);
  pPVar5->pSpec = pcVar6;
  pPVar5->nIns = nVars;
  pPVar5->nOuts = 1;
  iVar13 = ((nVars >> 5) + 1) - (uint)((nVars & 0x1fU) == 0);
  pPVar5->nInWords = iVar13;
  pPVar5->nOutWords = 1;
  if ((pPVar5->vCubes).nCap < (int)uVar3) {
    piVar8 = (pPVar5->vCubes).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc(lVar4 * 4);
    }
    else {
      piVar8 = (int *)realloc(piVar8,lVar4 * 4);
    }
    (pPVar5->vCubes).pArray = piVar8;
    if (piVar8 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pPVar5->vCubes).nCap = uVar3;
  }
  if (0 < (int)uVar3) {
    piVar8 = (pPVar5->vCubes).pArray;
    uVar12 = 0;
    do {
      piVar8[uVar12] = (int)uVar12;
      uVar12 = uVar12 + 1;
    } while (uVar17 != uVar12);
  }
  (pPVar5->vCubes).nSize = uVar3;
  uVar14 = iVar13 * uVar3;
  if ((pPVar5->vInBits).nCap < (int)uVar14) {
    pwVar9 = (pPVar5->vInBits).pArray;
    if (pwVar9 == (word *)0x0) {
      pwVar9 = (word *)malloc((long)(int)uVar14 << 3);
    }
    else {
      pwVar9 = (word *)realloc(pwVar9,(long)(int)uVar14 << 3);
    }
    (pPVar5->vInBits).pArray = pwVar9;
    if (pwVar9 == (word *)0x0) goto LAB_0035f529;
    (pPVar5->vInBits).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((pPVar5->vInBits).pArray,0,(ulong)uVar14 << 3);
  }
  (pPVar5->vInBits).nSize = uVar14;
  if ((pPVar5->vOutBits).nCap < (int)uVar3) {
    pwVar9 = (pPVar5->vOutBits).pArray;
    if (pwVar9 == (word *)0x0) {
      pwVar9 = (word *)malloc(lVar4 * 8);
    }
    else {
      pwVar9 = (word *)realloc(pwVar9,lVar4 * 8);
    }
    (pPVar5->vOutBits).pArray = pwVar9;
    if (pwVar9 == (word *)0x0) {
LAB_0035f529:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                    ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    (pPVar5->vOutBits).nCap = uVar3;
  }
  if (0 < (int)uVar3) {
    memset((pPVar5->vOutBits).pArray,0,uVar17 * 8);
  }
  (pPVar5->vOutBits).nSize = uVar3;
  iVar13 = (pPVar5->vCubeLits).nCap;
  if (iVar13 < (int)uVar3) {
    pVVar10 = (pPVar5->vCubeLits).pArray;
    if (pVVar10 == (Vec_Int_t *)0x0) {
      pVVar10 = (Vec_Int_t *)malloc(lVar4 << 4);
    }
    else {
      pVVar10 = (Vec_Int_t *)realloc(pVVar10,lVar4 << 4);
    }
    (pPVar5->vCubeLits).pArray = pVVar10;
    memset(pVVar10 + iVar13,0,(long)(int)(uVar3 - iVar13) << 4);
    (pPVar5->vCubeLits).nCap = uVar3;
  }
  (pPVar5->vCubeLits).nSize = uVar3;
  iVar15 = nVars * 2;
  iVar13 = (pPVar5->vOccurs).nCap;
  if (iVar13 < iVar15) {
    pVVar10 = (pPVar5->vOccurs).pArray;
    if (pVVar10 == (Vec_Int_t *)0x0) {
      pVVar10 = (Vec_Int_t *)malloc((long)iVar15 << 4);
    }
    else {
      pVVar10 = (Vec_Int_t *)realloc(pVVar10,(long)iVar15 << 4);
    }
    (pPVar5->vOccurs).pArray = pVVar10;
    memset(pVVar10 + iVar13,0,(long)(iVar15 - iVar13) << 4);
    (pPVar5->vOccurs).nCap = iVar15;
  }
  (pPVar5->vOccurs).nSize = iVar15;
  if (0 < (int)uVar3) {
    pwVar9 = __ptr_00->pArray;
    uVar12 = 0;
    do {
      if (0 < nVars) {
        uVar2 = pwVar9[uVar12];
        uVar3 = (int)uVar12 + 1;
        iVar15 = 0;
        iVar13 = nVars;
        do {
          uVar11 = uVar2 >> ((byte)iVar15 & 0x3e);
          if ((uVar11 & 3) != 0) {
            bVar19 = ((uint)uVar11 & 3) == 1;
            iVar16 = (pPVar5->vCubeLits).nSize;
            if ((long)iVar16 <= (long)uVar12) {
              uVar14 = iVar16 * 2;
              if ((int)uVar14 <= (int)uVar3) {
                uVar14 = uVar3;
              }
              iVar16 = (pPVar5->vCubeLits).nCap;
              if (iVar16 < (int)uVar14) {
                pVVar10 = (pPVar5->vCubeLits).pArray;
                if (pVVar10 == (Vec_Int_t *)0x0) {
                  pVVar10 = (Vec_Int_t *)malloc((ulong)uVar14 << 4);
                }
                else {
                  pVVar10 = (Vec_Int_t *)realloc(pVVar10,(ulong)uVar14 << 4);
                }
                (pPVar5->vCubeLits).pArray = pVVar10;
                memset(pVVar10 + iVar16,0,(long)(int)(uVar14 - iVar16) << 4);
                (pPVar5->vCubeLits).nCap = uVar14;
              }
              (pPVar5->vCubeLits).nSize = uVar3;
            }
            if ((long)(pPVar5->vCubeLits).nSize <= (long)uVar12) {
LAB_0035f50a:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                            ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            uVar14 = iVar15 + (uint)bVar19;
            Vec_IntPush((pPVar5->vCubeLits).pArray + uVar12,uVar14);
            iVar16 = (pPVar5->vOccurs).nSize;
            if (iVar16 <= (int)uVar14) {
              iVar18 = (uint)bVar19 + iVar15 + 1;
              iVar16 = iVar16 * 2;
              if (iVar16 <= iVar18) {
                iVar16 = iVar18;
              }
              iVar1 = (pPVar5->vOccurs).nCap;
              if (iVar1 < iVar16) {
                pVVar10 = (pPVar5->vOccurs).pArray;
                if (pVVar10 == (Vec_Int_t *)0x0) {
                  pVVar10 = (Vec_Int_t *)malloc((long)iVar16 << 4);
                }
                else {
                  pVVar10 = (Vec_Int_t *)realloc(pVVar10,(long)iVar16 << 4);
                }
                (pPVar5->vOccurs).pArray = pVVar10;
                memset(pVVar10 + iVar1,0,(long)(iVar16 - iVar1) << 4);
                (pPVar5->vOccurs).nCap = iVar16;
              }
              (pPVar5->vOccurs).nSize = iVar18;
            }
            if ((iVar15 < 0) || ((pPVar5->vOccurs).nSize <= (int)uVar14)) goto LAB_0035f50a;
            Vec_IntPush((pPVar5->vOccurs).pArray + uVar14,(int)uVar12);
          }
          iVar15 = iVar15 + 2;
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar17);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Bit_t *)0x0) {
    free(__ptr);
  }
  if (__ptr_00->pArray != (word *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (word *)0x0;
  }
  if (__ptr_00 != (Vec_Wrd_t *)0x0) {
    free(__ptr_00);
  }
  return pPVar5;
}

Assistant:

Pla_Man_t * Pla_ManFxPrepare( int nVars )
{
    Pla_Man_t * p; char Buffer[1000]; 
    Vec_Bit_t * vFunc = Pla_ManPrimesTable( nVars );
    Vec_Wrd_t * vSop = Pla_ManFxMinimize( (word *)Vec_BitArray(vFunc), nVars );
    word Cube, * pCube = &Cube; int i, k, Lit;
    sprintf( Buffer, "primes%02d", nVars );
    p = Pla_ManAlloc( Buffer, nVars, 1, Vec_WrdSize(vSop) );
    Vec_WecInit( &p->vCubeLits, Pla_ManCubeNum(p) );
    Vec_WecInit( &p->vOccurs, 2*Pla_ManInNum(p) );
    Vec_WrdForEachEntry( vSop, Cube, i )
        Pla_CubeForEachLit( nVars, pCube, Lit, k )
            if ( Lit != PLA_LIT_DASH )
            {
                Lit = Abc_Var2Lit( k, Lit == PLA_LIT_ZERO );
                Vec_WecPush( &p->vCubeLits, i, Lit );
                Vec_WecPush( &p->vOccurs, Lit, i );
            }
    Vec_BitFree( vFunc );
    Vec_WrdFree( vSop );
    return p;
}